

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::SourceTreeDescriptorDatabase::SingleFileErrorCollector::RecordError
          (SingleFileErrorCollector *this,int line,int column,string_view message)

{
  MultiFileErrorCollector *pMVar1;
  undefined4 local_18;
  undefined4 uStack_10;
  
  pMVar1 = this->multi_file_error_collector_;
  if (pMVar1 != (MultiFileErrorCollector *)0x0) {
    local_18 = (undefined4)message._M_len;
    uStack_10 = message._M_str._0_4_;
    (*pMVar1->_vptr_MultiFileErrorCollector[2])
              (pMVar1,(this->filename_)._M_string_length,(this->filename_)._M_dataplus._M_p,
               (ulong)(uint)line,column,(ulong)(uint)line,local_18,uStack_10);
  }
  this->had_errors_ = true;
  return;
}

Assistant:

void RecordError(int line, int column, absl::string_view message) override {
    if (multi_file_error_collector_ != nullptr) {
      multi_file_error_collector_->RecordError(filename_, line, column,
                                               message);
    }
    had_errors_ = true;
  }